

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absIter.c
# Opt level: O3

Gia_Man_t *
Gia_ManShrinkGla(Gia_Man_t *p,int nFrameMax,int nTimeOut,int fUsePdr,int fUseSat,int fUseBdd,
                int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint *puVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  Gia_Obj_t *pGVar19;
  double dVar20;
  timespec ts;
  uint local_98;
  uint local_94;
  timespec local_88;
  int local_74;
  Gia_Obj_t *local_70;
  void *local_68;
  long local_60;
  int local_58;
  int local_54;
  undefined8 local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  local_50 = CONCAT44(in_register_00000034,nFrameMax);
  local_54 = nTimeOut;
  iVar7 = clock_gettime(3,&local_88);
  if (iVar7 < 0) {
    local_48 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_48 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                  ,0x4a,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
  }
  pVVar9 = p->vGateClasses;
  if (pVVar9 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                  ,0x4b,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
  }
  local_60 = (long)pVVar9->nSize;
  if (local_60 == 0) {
    sVar12 = 0;
    local_68 = (void *)0x0;
  }
  else {
    sVar12 = local_60 * 4;
    local_68 = malloc(sVar12);
  }
  memcpy(local_68,pVVar9->pArray,sVar12);
  if ((int)local_50 == 0) {
    local_58 = Gia_IterTryImprove(p,0,0);
  }
  else {
    local_58 = (int)local_50 + -1;
  }
  local_40 = local_60 << 2;
  uVar8 = p->nObjs;
  local_98 = 0;
  local_94 = 0;
  do {
    if ((int)uVar8 < 2) break;
    local_74 = 0;
    uVar18 = 1;
    lVar11 = 0xc;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)(&pGVar3->field_0x0 + lVar11);
      uVar15 = (uint)uVar4;
      if ((uVar15 >> 0x1e & 1) == 0) {
        uVar1 = p->vGateClasses->nSize;
        if ((long)(int)uVar1 <= (long)uVar18) goto LAB_006100c5;
        piVar10 = p->vGateClasses->pArray;
        if (piVar10[uVar18] != 0) {
          uVar2 = p->vCos->nSize;
          if ((int)uVar2 <= p->nRegs) {
            __assert_fail("v < Gia_ManPoNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
          }
          if ((int)uVar2 < 1) goto LAB_006100c5;
          puVar5 = (uint *)p->vCos->pArray;
          uVar14 = *puVar5;
          if (((long)(int)uVar14 < 0) || (uVar8 <= uVar14)) goto LAB_00610122;
          pGVar19 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar11);
          if (pGVar19 ==
              pGVar3 + (int)uVar14 +
              -(ulong)((uint)*(undefined8 *)(pGVar3 + (int)uVar14) & 0x1fffffff)) goto LAB_0060ff91;
          pGVar6 = pGVar3 + uVar8;
          uVar14 = (uint)(uVar4 >> 0x20);
          local_70 = pGVar19;
          if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
            iVar7 = (int)(uVar4 & 0x1fffffff);
            pGVar19 = (Gia_Obj_t *)((long)pGVar3 + lVar11 + (ulong)(uint)(iVar7 * 4) * -3);
            if ((pGVar19 < pGVar3) || (pGVar6 <= pGVar19)) goto LAB_006100e4;
            uVar17 = (int)((long)(lVar11 + (ulong)(uint)(iVar7 << 2) * -3) >> 2) * -0x55555555;
            if (((int)uVar17 < 0) || (uVar1 <= uVar17)) goto LAB_006100c5;
            if (piVar10[uVar17 & 0x7fffffff] != 0) {
              uVar17 = uVar14 & 0x1fffffff;
              pGVar19 = (Gia_Obj_t *)((long)pGVar3 + lVar11 + (ulong)(uVar17 * 4) * -3);
              if ((pGVar19 < pGVar3) || (pGVar6 <= pGVar19)) goto LAB_006100e4;
              uVar17 = (int)((long)(lVar11 + (ulong)(uVar17 << 2) * -3) >> 2) * -0x55555555;
              if (((int)uVar17 < 0) || (uVar1 <= uVar17)) goto LAB_006100c5;
              if (piVar10[uVar17 & 0x7fffffff] != 0) goto LAB_0060ff91;
            }
          }
          if ((~uVar15 & 0x9fffffff) == 0) {
            uVar14 = uVar14 & 0x1fffffff;
            iVar7 = p->vCis->nSize;
            if (iVar7 - p->nRegs <= (int)uVar14) {
              uVar14 = (uVar2 - iVar7) + uVar14;
              if (uVar2 <= uVar14) {
LAB_006100c5:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar15 = puVar5[uVar14];
              if (((long)(int)uVar15 < 0) || (uVar8 <= uVar15)) {
LAB_00610122:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              pGVar19 = pGVar3 + (int)uVar15 +
                        -(ulong)((uint)*(undefined8 *)(pGVar3 + (int)uVar15) & 0x1fffffff);
              if ((pGVar19 < pGVar3) || (pGVar6 <= pGVar19)) goto LAB_006100e4;
              uVar15 = (int)((long)pGVar19 - (long)pGVar3 >> 2) * -0x55555555;
              if (((int)uVar15 < 0) || (uVar1 <= uVar15)) goto LAB_006100c5;
              if (piVar10[uVar15 & 0x7fffffff] != 0) goto LAB_0060ff91;
            }
          }
          iVar7 = clock_gettime(3,&local_88);
          pGVar19 = local_70;
          if (iVar7 < 0) {
            lVar13 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
            lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_88.tv_sec * -1000000;
          }
          printf("%5d : ",(ulong)local_94);
          printf("Obj =%7d   ",uVar18 & 0xffffffff);
          iVar7 = local_58;
          pGVar6 = p->pObjs;
          if ((pGVar19 < pGVar6) || (pGVar6 + p->nObjs <= pGVar19)) goto LAB_006100e4;
          uVar8 = (int)((long)pGVar3 + (lVar11 - (long)pGVar6) >> 2) * -0x55555555;
          if (((int)uVar8 < 0) || (p->vGateClasses->nSize <= (int)uVar8)) {
LAB_00610103:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          p->vGateClasses->pArray[uVar8 & 0x7fffffff] = 0;
          local_38 = lVar13;
          uVar8 = Gia_IterTryImprove(p,local_54,local_58);
          if ((int)local_50 == 0) {
            if (iVar7 < (int)uVar8) {
              __assert_fail("iFrame <= iFrame0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                            ,0x6e,
                            "Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)"
                           );
            }
          }
          else if ((int)local_50 < (int)uVar8) {
            __assert_fail("iFrame <= nFrameMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                          ,0x6c,
                          "Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
          }
          printf("Frame =%6d   ",(ulong)uVar8);
          if ((int)uVar8 < iVar7) {
            local_70->field_0x3 = local_70->field_0x3 | 0x40;
            pGVar19 = p->pObjs;
            if ((local_70 < pGVar19) || (pGVar19 + p->nObjs <= local_70)) {
LAB_006100e4:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar8 = (int)((long)pGVar3 + (lVar11 - (long)pGVar19) >> 2) * -0x55555555;
            if (((int)uVar8 < 0) || (p->vGateClasses->nSize <= (int)uVar8)) goto LAB_00610103;
            p->vGateClasses->pArray[uVar8 & 0x7fffffff] = 1;
            printf("           ");
          }
          else {
            printf("Removing   ");
            pGVar19 = p->pObjs;
            if ((local_70 < pGVar19) || (pGVar19 + p->nObjs <= local_70)) goto LAB_006100e4;
            uVar8 = (int)((long)pGVar3 + (lVar11 - (long)pGVar19) >> 2) * -0x55555555;
            if (((int)uVar8 < 0) || ((int)local_60 <= (int)uVar8)) goto LAB_00610103;
            local_98 = local_98 + 1;
            *(undefined4 *)((long)local_68 + (ulong)(uVar8 & 0x7fffffff) * 4) = 0;
            local_74 = 1;
          }
          iVar16 = 3;
          iVar7 = clock_gettime(3,&local_88);
          if (iVar7 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
          }
          lVar13 = lVar13 + local_38;
          Abc_Print(iVar16,"%s =","Time");
          Abc_Print(iVar16,"%9.2f sec\n",(double)lVar13 / 1000000.0);
          pVVar9 = p->vGateClasses;
          if (pVVar9 != (Vec_Int_t *)0x0) {
            if (pVVar9->pArray != (int *)0x0) {
              free(pVVar9->pArray);
              p->vGateClasses->pArray = (int *)0x0;
              pVVar9 = p->vGateClasses;
              if (pVVar9 == (Vec_Int_t *)0x0) goto LAB_0060ff33;
            }
            free(pVVar9);
          }
LAB_0060ff33:
          pVVar9 = (Vec_Int_t *)malloc(0x10);
          sVar12 = local_40;
          iVar7 = (int)local_60;
          pVVar9->nSize = iVar7;
          pVVar9->nCap = iVar7;
          if (iVar7 == 0) {
            sVar12 = 0;
            piVar10 = (int *)0x0;
          }
          else {
            piVar10 = (int *)malloc(local_40);
          }
          local_94 = local_94 + 1;
          pVVar9->pArray = piVar10;
          memcpy(piVar10,local_68,sVar12);
          p->vGateClasses = pVVar9;
          uVar8 = p->nObjs;
        }
      }
LAB_0060ff91:
      uVar18 = uVar18 + 1;
      lVar11 = lVar11 + 0xc;
    } while ((long)uVar18 < (long)(int)uVar8);
  } while (local_74 != 0);
  Gia_ManCleanMark0(p);
  if (local_68 != (void *)0x0) {
    free(local_68);
  }
  iVar7 = 0;
  printf("Tried = %d.  ",(ulong)local_94);
  lVar11 = (long)p->vGateClasses->nSize;
  if (lVar11 < 1) {
    dVar20 = 0.0;
  }
  else {
    lVar13 = 0;
    do {
      iVar7 = iVar7 + (uint)(0 < p->vGateClasses->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar11 != lVar13);
    dVar20 = (double)iVar7;
  }
  printf("Removed = %d. (%.2f %%)  ",((double)(int)local_98 * 100.0) / dVar20,(ulong)local_98);
  iVar16 = 3;
  iVar7 = clock_gettime(3,&local_88);
  if (iVar7 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
  }
  lVar11 = lVar11 + local_48;
  Abc_Print(iVar16,"%s =","Time");
  Abc_Print(iVar16,"%9.2f sec\n",(double)lVar11 / 1000000.0);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManShrinkGla( Gia_Man_t * p, int nFrameMax, int nTimeOut, int fUsePdr, int fUseSat, int fUseBdd, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, iFrame0, iFrame;
    int nTotal = 0, nRemoved = 0;
    Vec_Int_t * vGScopy;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManPoNum(p) == 1 );
    assert( p->vGateClasses != NULL );
    vGScopy = Vec_IntDup( p->vGateClasses );
    if ( nFrameMax == 0 )
        iFrame0 = Gia_IterTryImprove( p, 0, 0 );
    else
        iFrame0 = nFrameMax - 1;
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( pObj->fMark0 )
                continue;
            if ( !Gia_ObjIsInGla(p, pObj) )
                continue;
            if ( pObj == Gia_ObjFanin0( Gia_ManPo(p, 0) ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsInGla(p, Gia_ObjFanin1(pObj)) )
                    continue;
            }
            if ( Gia_ObjIsRo(p, pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))) )
                    continue;
            }        
            clk = Abc_Clock();
            printf( "%5d : ", nTotal );
            printf( "Obj =%7d   ", i );
            Gia_ObjRemFromGla( p, pObj );
            iFrame = Gia_IterTryImprove( p, nTimeOut, iFrame0 );
            if ( nFrameMax )
                assert( iFrame <= nFrameMax );
            else
                assert( iFrame <= iFrame0 );
            printf( "Frame =%6d   ", iFrame );
            if ( iFrame < iFrame0 )
            {
                pObj->fMark0 = 1;
                Gia_ObjAddToGla( p, pObj );
                printf( "           " );
            }
            else
            {
                fChanges = 1;
                nRemoved++;
                printf( "Removing   " );
                Vec_IntWriteEntry( vGScopy, Gia_ObjId(p, pObj), 0 );
            }
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            nTotal++;
            // update the classes
            Vec_IntFreeP( &p->vGateClasses );
            p->vGateClasses = Vec_IntDup(vGScopy);
        }
        if ( !fChanges )
            break;
    }
    Gia_ManCleanMark0(p);
    Vec_IntFree( vGScopy );
    printf( "Tried = %d.  ",     nTotal );
    printf( "Removed = %d. (%.2f %%)  ",  nRemoved, 100.0 * nRemoved / Vec_IntCountPositive(p->vGateClasses) );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clkTotal );
    return NULL;
}